

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualMemory_unix.cpp
# Opt level: O1

bool __thiscall xmrig::VirtualMemory::allocateLargePagesMemory(VirtualMemory *this)

{
  int iVar1;
  uint8_t *__addr;
  
  __addr = (uint8_t *)mmap((void *)0x0,this->m_size,3,0x48022,0,0);
  if (__addr == (uint8_t *)0xffffffffffffffff) {
    __addr = (uint8_t *)0x0;
  }
  this->m_scratchpad = __addr;
  if (__addr != (uint8_t *)0x0) {
    *(byte *)&(this->m_flags).super__Base_bitset<1UL>._M_w =
         (byte)(this->m_flags).super__Base_bitset<1UL>._M_w | 1;
    madvise(__addr,this->m_size,3);
    iVar1 = mlock(this->m_scratchpad,this->m_size);
    if (iVar1 == 0) {
      *(byte *)&(this->m_flags).super__Base_bitset<1UL>._M_w =
           (byte)(this->m_flags).super__Base_bitset<1UL>._M_w | 2;
    }
  }
  return __addr != (uint8_t *)0x0;
}

Assistant:

bool xmrig::VirtualMemory::allocateLargePagesMemory()
{
    m_scratchpad = static_cast<uint8_t*>(allocateLargePagesMemory(m_size));
    if (m_scratchpad) {
        m_flags.set(FLAG_HUGEPAGES, true);

        madvise(m_scratchpad, m_size, MADV_RANDOM | MADV_WILLNEED);

        if (mlock(m_scratchpad, m_size) == 0) {
            m_flags.set(FLAG_LOCK, true);
        }

        return true;
    }

    return false;
}